

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetTxInIndexByHandle
              (void *handle,void *tx_data_handle,char *txid,uint32_t vout,uint32_t *index)

{
  long *plVar1;
  bool bVar2;
  uint32_t uVar3;
  CfdException *pCVar4;
  allocator local_91;
  OutPoint outpoint;
  string local_68;
  bool is_bitcoin;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&outpoint,"TransactionData",(allocator *)&local_68);
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&outpoint);
  std::__cxx11::string::~string((string *)&outpoint);
  bVar2 = cfd::capi::IsEmptyString(txid);
  if (bVar2) {
    outpoint.txid_._vptr_Txid = (_func_int **)0x5277c7;
    outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xfbb;
    outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdGetTxInIndexByHandle";
    cfd::core::logger::warn<>((CfdSourceLocation *)&outpoint,"txid is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&outpoint,"Failed to parameter. txid is null or empty.",
               (allocator *)&local_68);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&outpoint);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&is_bitcoin,txid,&local_91);
  cfd::core::Txid::Txid((Txid *)&local_68,(string *)&is_bitcoin);
  cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&local_68,vout);
  cfd::core::Txid::~Txid((Txid *)&local_68);
  std::__cxx11::string::~string((string *)&is_bitcoin);
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&is_bitcoin);
  plVar1 = *(long **)((long)tx_data_handle + 0x18);
  if (plVar1 == (long *)0x0) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_68,"Invalid handle state. tx is null",&local_91);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,&local_68);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (is_bitcoin == true) {
    if (index == (uint32_t *)0x0) goto LAB_003bdcb0;
    uVar3 = (**(code **)(*plVar1 + 0x78))(plVar1,&outpoint);
  }
  else {
    if (index == (uint32_t *)0x0) goto LAB_003bdcb0;
    uVar3 = (**(code **)(*plVar1 + 0x78))(plVar1,&outpoint);
  }
  *index = uVar3;
LAB_003bdcb0:
  cfd::core::Txid::~Txid(&outpoint.txid_);
  return 0;
}

Assistant:

int CfdGetTxInIndexByHandle(
    void* handle, void* tx_data_handle, const char* txid, uint32_t vout,
    uint32_t* index) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    OutPoint outpoint(Txid(txid), vout);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      if (index != nullptr) *index = tx->GetTxInIndex(outpoint);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      if (index != nullptr) *index = tx->GetTxInIndex(outpoint);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}